

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,void *ptr)

{
  ImGuiID id_00;
  uint *puVar1;
  ImGuiID id;
  ImGuiID seed;
  void *ptr_local;
  ImGuiWindow *this_local;
  
  _id = ptr;
  ptr_local = this;
  puVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  id_00 = ImHashData(&id,8,*puVar1);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_Pointer, ptr);
#endif
    return id;
}